

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_typed_attr<tinyusdz::value::matrix4d>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<tinyusdz::value::matrix4d>_> *attr,
                   string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pPVar3;
  Path *v;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  ostream *poVar8;
  uint32_t indent_00;
  pointer pPVar9;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  long lVar10;
  char *pcVar11;
  double *pdVar12;
  string *psVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  byte bVar17;
  matrix4d a;
  stringstream ss;
  string local_310;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  string *local_290;
  byte local_288;
  double local_280 [16];
  byte local_200;
  char local_1ff;
  TypedTimeSamples<tinyusdz::value::matrix4d> local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar17 = 0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar7 = (attr->_attrib).has_value_;
  if ((((bVar7 == false) &&
       ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start)) && (attr->_value_empty == false)) &&
     (attr->_blocked != true)) goto LAB_0017e7f1;
  pPVar3 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar9 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pPVar9 == pPVar3 && bVar7 == false) && (attr->_blocked == false)) {
    cVar2 = attr->_value_empty;
  }
  else {
    cVar2 = '\0';
  }
  bVar14 = pPVar9 != pPVar3;
  local_290 = __return_storage_ptr__;
  local_288 = bVar7;
  if ((bVar7 ^ 1U) == 0) {
    memcpy(local_280,&(attr->_attrib).contained,0x82);
    std::
    vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
    ::vector(&local_1f8._samples,
             (vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
              *)((long)&(attr->_attrib).contained + 0x88));
    local_1f8._dirty = *(bool *)((long)&(attr->_attrib).contained + 0xa0);
  }
  bVar5 = local_200;
  bVar4 = local_288;
  indent_00 = (uint32_t)pPVar9;
  if (local_288 == 1) {
    if (local_1f8._dirty == true) {
      TypedTimeSamples<tinyusdz::value::matrix4d>::update(&local_1f8);
    }
    bVar15 = local_1f8._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_1f8._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    bVar15 = false;
  }
  if (((local_288 == 1) && (local_1ff == '\0')) && (local_200 == 0)) {
    bVar16 = local_1f8._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_1f8._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar16 = false;
  }
  bVar6 = AttrMetas::authored(&attr->_metas);
  if (((bVar6) || ((byte)(bVar14 & (bVar7 ^ 1U) | bVar16) != 1)) ||
     (n_01 = n, (cVar2 != '\0' || attr->_blocked != false) || (bVar4 & bVar5) != 0)) {
    pprint::Indent_abi_cxx11_(&local_310,(pprint *)(ulong)indent,n);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_310._M_dataplus._M_p,local_310._M_string_length);
    paVar1 = &local_310.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != paVar1) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    local_310.field_2._M_allocated_capacity = 0x643478697274616d;
    local_310._M_string_length = 8;
    local_310.field_2._8_8_ = local_310.field_2._8_8_ & 0xffffffffffffff00;
    local_310._M_dataplus._M_p = (pointer)paVar1;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != paVar1) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    if (attr->_blocked == true) {
      pcVar11 = " = None";
      lVar10 = 7;
LAB_0017e464:
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar11,lVar10);
    }
    else if ((bVar4 & bVar5) != 0) {
      local_310._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      local_310._M_string_length = 0;
      local_310.field_2._M_allocated_capacity = 0;
      local_310.field_2._8_8_ = 0;
      uStack_2f0 = 0;
      local_2e8 = 0x3ff0000000000000;
      local_2e0 = 0;
      uStack_2d8 = 0;
      local_2d0 = 0;
      uStack_2c8 = 0;
      local_2c0 = 0x3ff0000000000000;
      local_2b8 = 0;
      uStack_2b0 = 0;
      local_2a8 = 0;
      uStack_2a0 = 0;
      local_298 = 0x3ff0000000000000;
      if (local_288 == 0) goto LAB_0017e850;
      if ((local_1ff != '\0') || (local_200 != 1)) {
        pcVar11 = " = [InternalError]";
        lVar10 = 0x12;
        goto LAB_0017e464;
      }
      pdVar12 = local_280;
      psVar13 = &local_310;
      for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
        (psVar13->_M_dataplus)._M_p = (pointer)*pdVar12;
        pdVar12 = pdVar12 + (ulong)bVar17 * -2 + 1;
        psVar13 = (string *)((long)psVar13 + ((ulong)bVar17 * -2 + 1) * 8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      indent_00 = (uint32_t)lVar10;
      std::operator<<(local_1a8,(matrix4d *)&local_310);
    }
    bVar7 = AttrMetas::authored(&attr->_metas);
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      print_attr_metas_abi_cxx11_
                (&local_310,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_310._M_dataplus._M_p,local_310._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != paVar1) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  if (bVar15) {
    pprint::Indent_abi_cxx11_(&local_310,(pprint *)(ulong)indent,n_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_310._M_dataplus._M_p,local_310._M_string_length);
    paVar1 = &local_310.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != paVar1) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    local_310.field_2._M_allocated_capacity = 0x643478697274616d;
    local_310._M_string_length = 8;
    local_310.field_2._8_8_ = local_310.field_2._8_8_ & 0xffffffffffffff00;
    local_310._M_dataplus._M_p = (pointer)paVar1;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != paVar1) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    if (local_288 == 0) {
LAB_0017e850:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>>::value() const [T = tinyusdz::Animatable<tinyusdz::value::matrix4d>]"
                   );
    }
    print_typed_timesamples<tinyusdz::value::matrix4d>(&local_310,&local_1f8,indent);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_310._M_dataplus._M_p,local_310._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != paVar1) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_00;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_310,(pprint *)(ulong)indent,n_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_310._M_dataplus._M_p,local_310._M_string_length);
    paVar1 = &local_310.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != paVar1) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    local_310.field_2._M_allocated_capacity = 0x643478697274616d;
    local_310._M_string_length = 8;
    local_310.field_2._8_8_ = local_310.field_2._8_8_ & 0xffffffffffffff00;
    local_310._M_dataplus._M_p = (pointer)paVar1;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != paVar1) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar10 = ((long)(attr->_paths).
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar10 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar10 == 1) {
      std::operator<<(local_1a8,v);
    }
    else {
      std::operator<<(local_1a8,&attr->_paths);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  __return_storage_ptr__ = local_290;
  if ((local_288 == 1) &&
     (local_1f8._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_1f8._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__ = local_290;
  }
LAB_0017e7f1:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}